

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

int adios2::utils::readVar<double>(Engine *fp,IO *io,Variable<double> *variable)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  reference puVar6;
  undefined8 uVar7;
  reference pvVar8;
  pair *ppVar9;
  unsigned_long *puVar10;
  ostream *poVar11;
  uint uVar12;
  pair *in_RDX;
  Variable *in_RDI;
  Accuracy a;
  bool incdim;
  Dims countv;
  Dims startv;
  bool xmlprint;
  uint64_t ct;
  uint64_t st;
  unsigned_long d;
  iterator __end0;
  iterator __begin0;
  Dims *__range3_1;
  bool changingShape;
  Dims dimsign;
  unsigned_long dim;
  iterator __end3;
  iterator __begin3;
  Dims *__range3;
  Dims shape;
  size_t absstep;
  int ndim;
  int nsteps;
  size_t elemsize;
  int ndigits_dims [32];
  uint64_t readn [16];
  uint64_t actualreadn;
  uint64_t maxreadn;
  uint64_t sum;
  vector<double,_std::allocator<double>_> dataV;
  uint64_t stepCount;
  uint64_t stepStart;
  uint64_t nelems;
  int tidx;
  int tdims;
  uint64_t c [16];
  uint64_t s [16];
  uint64_t count_t [16];
  uint64_t start_t [16];
  int j;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa28;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffa30;
  char *pcVar13;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa38;
  ostream *in_stack_fffffffffffffa40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa48;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffa50;
  size_t in_stack_fffffffffffffa58;
  Variable<double> *in_stack_fffffffffffffa60;
  Engine *in_stack_fffffffffffffa68;
  uint64_t *in_stack_fffffffffffffa70;
  undefined7 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7f;
  VariableBase *in_stack_fffffffffffffa80;
  uint local_53c;
  double local_538;
  double local_530;
  byte local_528;
  pair<unsigned_long,_unsigned_long> local_518 [4];
  undefined1 local_4d8 [24];
  undefined1 local_4c0 [24];
  int *in_stack_fffffffffffffb58;
  string local_4a0 [4];
  int in_stack_fffffffffffffb64;
  Variable<double> *in_stack_fffffffffffffb68;
  IO *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  DataType in_stack_fffffffffffffb7c;
  undefined7 in_stack_fffffffffffffb80;
  ulong local_460;
  long local_458;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_440;
  undefined1 *local_438;
  byte local_429;
  undefined1 local_428 [24];
  unsigned_long local_410;
  unsigned_long *local_408;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_400;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_3f8;
  undefined1 local_3f0 [24];
  undefined1 local_3d8 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3c0;
  size_t local_3a8;
  int local_39c;
  int local_398;
  uint local_384;
  ulong local_380;
  int local_378 [32];
  ulong auStack_2f8 [16];
  long local_278;
  ulong local_270;
  ulong local_268;
  undefined1 local_260 [24];
  ulong local_248;
  long local_240;
  ulong local_238;
  int local_230;
  int local_22c;
  unsigned_long local_228 [16];
  unsigned_long local_1a8 [16];
  ulong local_128 [16];
  unsigned_long local_a8 [16];
  int local_28;
  uint local_24;
  pair *local_20;
  Variable *local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1bbcbc);
  local_380 = *(ulong *)(local_20 + 0x30);
  if ((timestep & 1) == 0) {
    local_53c = adios2::core::VariableBase::GetAvailableStepsCount();
  }
  else {
    local_53c = 1;
  }
  local_384 = local_53c;
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_20 + 0x58));
  local_398 = (int)sVar5;
  local_238 = 1;
  local_230 = 0;
  local_240 = 0;
  local_248 = 1;
  if (((timestep & 1) == 0) && (1 < (int)local_384)) {
    if ((long)istart < 0) {
      local_240 = (long)(int)local_384 + istart;
    }
    else {
      local_240 = istart;
    }
    if ((long)icount < 0) {
      local_248 = ((long)(int)local_384 + icount + 1) - local_240;
    }
    else {
      local_248 = icount;
    }
    if (2 < verbose) {
      printf("    j=0, stepStart=%lu stepCount=%lu\n",local_240,local_248);
    }
    if ((ulong)(long)(int)local_384 < local_240 + local_248) {
      printf("ERROR: The sum of start step (%lu) and step count (%lu) is larger than the number of steps available (%d)\n"
             ,local_240,local_248,(ulong)local_384);
      local_4 = -1;
      local_39c = 1;
      goto LAB_001bd202;
    }
    local_a8[0] = local_240;
    local_128[0] = local_248;
    local_238 = local_248 * local_238;
    if (1 < verbose) {
      printf("    s[0]=%lu, c[0]=%lu, n=%lu\n",local_240,local_248,local_238);
    }
    local_230 = 1;
  }
  local_22c = local_398 + local_230;
  local_3a8 = relative_to_absolute_step<double>
                        (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                         in_stack_fffffffffffffa58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bbf62);
  if ((timestep & 1) == 0) {
    adios2::core::VariableBase::Shape((ulong)local_3f0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40,
               in_stack_fffffffffffffa38);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
  }
  else {
    adios2::core::VariableBase::Shape((ulong)local_3d8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40,
               in_stack_fffffffffffffa38);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
  }
  if (2 < verbose) {
    printf("    starting step=%lu absolute step=%zu, dims={",local_240,local_3a8);
    local_3f8 = &local_3c0;
    local_400._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffffa28);
    local_408 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          (in_stack_fffffffffffffa28);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffa30,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffa28), bVar2) {
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_400);
      local_410 = *puVar6;
      printf("%zu",local_410);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_400);
    }
    printf("}\n");
  }
  if (local_230 == 0) {
LAB_001bc333:
    for (local_28 = 0; local_28 < local_398; local_28 = local_28 + 1) {
      if ((long)(&istart)[local_28 + local_230] < 0) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_3c0,(long)local_28);
        local_458 = *pvVar8 + (&istart)[local_28 + local_230];
      }
      else {
        local_458 = (&istart)[local_28 + local_230];
      }
      if ((long)(&icount)[local_28 + local_230] < 0) {
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_3c0,(long)local_28);
        local_460 = (*pvVar8 + (&icount)[local_28 + local_230] + 1) - local_458;
      }
      else {
        local_460 = (&icount)[local_28 + local_230];
      }
      if (2 < verbose) {
        printf("    j=%d, st=%lu ct=%lu\n",(ulong)(uint)(local_28 + local_230),local_458,local_460);
      }
      local_a8[local_28 + local_230] = local_458;
      local_128[local_28 + local_230] = local_460;
      local_238 = local_460 * local_238;
      if (1 < verbose) {
        uVar12 = local_28 + local_230;
        printf("    s[%d]=%lu, c[%d]=%lu, n=%lu\n",(ulong)uVar12,local_a8[(int)uVar12],(ulong)uVar12
               ,local_128[(int)uVar12],local_238);
      }
    }
    if (1 < verbose) {
      printf(" total size of data to read = %lu\n",local_238 * local_380);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa80,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffa7f,in_stack_fffffffffffffa78));
    print_slice_info(in_stack_fffffffffffffa80,(bool)in_stack_fffffffffffffa7f,
                     in_stack_fffffffffffffa70,(uint64_t *)in_stack_fffffffffffffa68,
                     (Dims *)in_stack_fffffffffffffa60);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_380;
    local_270 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xa00000)) / auVar1,0);
    if (local_238 < local_270) {
      local_270 = local_238;
    }
    ppVar9 = local_20 + 8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,".xml",(allocator *)&stack0xfffffffffffffb5f);
    bVar3 = adios2::helper::EndsWith((string *)ppVar9,local_4a0,false);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb5f);
    bVar3 = bVar3 & 1;
    if ((bVar3 != 0) && (local_270 < local_238)) {
      local_270 = local_238;
    }
    if (1 < verbose) {
      printf("Read size strategy:\n");
    }
    local_268 = 1;
    local_278 = 1;
    for (local_24 = local_22c - 1; -1 < (int)local_24; local_24 = local_24 - 1) {
      if (local_268 < local_270) {
        auStack_2f8[(int)local_24] = local_270 / (ulong)(long)(int)local_268;
        if (local_128[(int)local_24] < auStack_2f8[(int)local_24]) {
          auStack_2f8[(int)local_24] = local_128[(int)local_24];
        }
      }
      else {
        auStack_2f8[(int)local_24] = 1;
      }
      if (1 < verbose) {
        printf("    dim %d: read %lu elements\n",(ulong)local_24,auStack_2f8[(int)local_24]);
      }
      local_268 = local_268 * local_128[(int)local_24];
      local_278 = local_278 * auStack_2f8[(int)local_24];
    }
    if (1 < verbose) {
      printf("    read %lu elements at once, %lu in total (nelems=%lu)\n",local_278,local_268,
             local_238);
    }
    for (local_28 = 0; local_28 < local_22c; local_28 = local_28 + 1) {
      local_1a8[local_28] = local_a8[local_28];
      local_228[local_28] = auStack_2f8[local_28];
      iVar4 = ndigits(0x1bc965);
      local_378[local_28] = iVar4;
    }
    local_268 = 0;
    while (local_268 < local_238) {
      local_278 = 1;
      for (local_28 = 0; local_28 < local_22c; local_28 = local_28 + 1) {
        local_278 = local_228[local_28] * local_278;
      }
      if (2 < verbose) {
        uVar7 = std::__cxx11::string::c_str();
        printf("adios_read_var name=%s ",uVar7);
        printf("%s = { ","  start");
        for (local_28 = 0; local_28 < local_22c; local_28 = local_28 + 1) {
          printf("%lu ",local_1a8[local_28]);
        }
        printf("}");
        printf("%s = { ","  count");
        for (local_28 = 0; local_28 < local_22c; local_28 = local_28 + 1) {
          printf("%lu ",local_228[local_28]);
        }
        printf("}");
        printf("  read %lu elems\n");
      }
      if (*(int *)(local_20 + 0x40) == 2) {
        adios2::helper::Uint64ArrayToSizetVector
                  ((ulong)local_4c0,(ulong *)(long)(local_22c - local_230));
      }
      else {
        memset(local_4c0,0,0x18);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bcba8);
      }
      if (*(int *)(local_20 + 0x40) == 2) {
        adios2::helper::Uint64ArrayToSizetVector
                  ((ulong)local_4d8,(ulong *)(long)(local_22c - local_230));
      }
      else {
        memset(local_4d8,0,0x18);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bcc0e);
      }
      if (2 < verbose) {
        printf("set selection: ");
        printf("%s = { ","  start");
        for (local_28 = 0; local_28 < local_22c - local_230; local_28 = local_28 + 1) {
          puVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bcc73);
          printf("%zu ",puVar10[local_28]);
        }
        printf("}");
        printf("%s = { ","  count");
        for (local_28 = 0; local_28 < local_22c - local_230; local_28 = local_28 + 1) {
          puVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bcd15);
          printf("%zu ",puVar10[local_28]);
        }
        printf("}");
        printf("\n");
      }
      if (*(int *)(local_20 + 0x40) == 2) {
        ppVar9 = local_20;
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                  (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffa40);
        adios2::core::VariableBase::SetSelection(ppVar9);
        std::
        pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair(in_stack_fffffffffffffa30);
      }
      if (local_230 != 0) {
        if (2 < verbose) {
          printf("set Step selection: from relative step %lu read %lu steps\n",local_1a8[0],
                 local_228[0]);
        }
        ppVar9 = local_20;
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                  (local_518,local_1a8,local_228);
        adios2::core::VariableBase::SetStepSelection(ppVar9);
      }
      adios2::core::Variable<double>::SelectionSize();
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa50,
                 (size_type)in_stack_fffffffffffffa48);
      adios2::core::Engine::Get<double>(local_10,local_20,(Mode)local_260);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x1bcebb);
      print_dataset((void *)CONCAT17(bVar3,in_stack_fffffffffffffb80),in_stack_fffffffffffffb7c,
                    (uint64_t *)in_stack_fffffffffffffb70,(uint64_t *)in_stack_fffffffffffffb68,
                    in_stack_fffffffffffffb64,in_stack_fffffffffffffb58);
      local_268 = local_278 + local_268;
      bVar2 = true;
      for (local_28 = local_22c + -1; -1 < local_28; local_28 = local_28 + -1) {
        if (bVar2) {
          if (local_1a8[local_28] + local_228[local_28] == local_a8[local_28] + local_128[local_28])
          {
            local_1a8[local_28] = local_a8[local_28];
            local_228[local_28] = auStack_2f8[local_28];
            bVar2 = true;
          }
          else {
            local_1a8[local_28] = auStack_2f8[local_28] + local_1a8[local_28];
            if (local_a8[local_28] + local_128[local_28] < local_1a8[local_28] + local_228[local_28]
               ) {
              local_228[local_28] = (local_a8[local_28] + local_128[local_28]) - local_1a8[local_28]
              ;
            }
            bVar2 = false;
          }
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40)
      ;
    }
    print_endline();
    if ((accuracyWasSet & 1) != 0) {
      adios2::core::VariableBase::GetAccuracy();
      poVar11 = std::operator<<((ostream *)&std::cout,"Read accuracy was (error = ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_538);
      poVar11 = std::operator<<(poVar11,", norm = ");
      in_stack_fffffffffffffa40 = (ostream *)std::ostream::operator<<(poVar11,local_530);
      poVar11 = std::operator<<(in_stack_fffffffffffffa40,", ");
      if ((local_528 & 1) == 0) {
        pcVar13 = "abs";
      }
      else {
        pcVar13 = "rel";
      }
      poVar11 = std::operator<<(poVar11,pcVar13);
      std::operator<<(poVar11,")\n");
    }
    local_4 = 0;
    local_39c = 1;
  }
  else {
    get_global_array_signature<double>
              ((Engine *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
               in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    local_429 = 0;
    local_438 = local_428;
    local_440._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffffa28);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffa28);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffa30,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffa28), bVar2) {
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_440);
      if (*puVar6 == 0) {
        local_429 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_440);
    }
    if (((local_429 & 1) == 0) || (local_248 < 2)) {
      local_39c = 0;
    }
    else {
      printf(
            "ERROR: This variable has a changing shape over time, so bpls cannot dump it as a global array. \n"
            );
      uVar7 = std::__cxx11::string::c_str();
      printf("You can dump a single step with\n    bpls -d %s -s \"T",uVar7);
      for (local_28 = 0; local_28 < local_398; local_28 = local_28 + 1) {
        printf(",0");
      }
      printf("\" -c \"1");
      for (local_28 = 0; local_28 < local_398; local_28 = local_28 + 1) {
        printf(",-1");
      }
      printf("\"\nwhere T is a number between 0 and %d,\n",(ulong)(local_384 - 1));
      uVar7 = std::__cxx11::string::c_str();
      printf("or dump each block separately with \n    bpls -dD %s\n",uVar7);
      local_4 = -1;
      local_39c = 1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
    if (local_39c == 0) goto LAB_001bc333;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa40);
LAB_001bd202:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa40);
  return local_4;
}

Assistant:

int readVar(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    int i, j;
    uint64_t start_t[MAX_DIMS],
        count_t[MAX_DIMS]; // processed <0 values in start/count
    uint64_t s[MAX_DIMS],
        c[MAX_DIMS]; // for block reading of smaller chunks
    int tdims;       // number of dimensions including time
    int tidx;        // 0 or 1 to account for time dimension
    uint64_t nelems; // number of elements to read
    // size_t elemsize;                   // size in bytes of one element
    uint64_t stepStart, stepCount;
    std::vector<T> dataV;
    uint64_t sum;             // working var to sum up things
    uint64_t maxreadn;        // max number of elements to read once up to a limit
                              // (10MB of data)
    uint64_t actualreadn;     // our decision how much to read at once
    uint64_t readn[MAX_DIMS]; // how big chunk to read in in each dimension?
    int ndigits_dims[32];     // # of digits (to print) of each dimension

    const size_t elemsize = variable->m_ElementSize;
    const int nsteps = (timestep ? 1 : static_cast<int>(variable->GetAvailableStepsCount()));
    const int ndim = static_cast<int>(variable->m_Shape.size());
    // create the counter arrays with the appropriate lengths
    // transfer start and count arrays to format dependent arrays

    nelems = 1;
    tidx = 0;
    stepStart = 0;
    stepCount = 1;

    if (!timestep && nsteps > 1)
    {
        // user selection must start with step selection
        // calculate the starting step and number of steps requested
        if (istart[0] < 0) // negative index means last-|index|
            stepStart = nsteps + istart[0];
        else
            stepStart = istart[0];
        if (icount[0] < 0) // negative index means last-|index|+1-start
            stepCount = nsteps + icount[0] + 1 - stepStart;
        else
            stepCount = icount[0];

        if (verbose > 2)
            printf("    j=0, stepStart=%" PRIu64 " stepCount=%" PRIu64 "\n", stepStart, stepCount);

        if (stepStart + stepCount > static_cast<uint64_t>(nsteps))
        {
            printf("ERROR: The sum of start step (%" PRIu64 ") and step count (%" PRIu64
                   ") is larger "
                   "than the number of steps available (%d)\n",
                   stepStart, stepCount, nsteps);
            return -1;
        }

        start_t[0] = stepStart;
        count_t[0] = stepCount;
        nelems *= stepCount;
        if (verbose > 1)
            printf("    s[0]=%" PRIu64 ", c[0]=%" PRIu64 ", n=%" PRIu64 "\n", start_t[0],
                   count_t[0], nelems);
        tidx = 1;
    }

    tdims = ndim + tidx;

    // Absolute step is needed to access Shape of variable in a step
    // and also for StepSelection
    size_t absstep = relative_to_absolute_step(fp, variable, stepStart);

    // Get the shape of the variable for the starting step
    Dims shape;
    if (timestep)
    {
        shape = variable->Shape();
    }
    else
    {
        shape = variable->Shape(absstep);
    }
    if (verbose > 2)
    {
        printf("    starting step=%" PRIu64 " absolute step=%zu"
               ", dims={",
               stepStart, absstep);
        for (auto dim : shape)
        {
            printf("%zu", dim);
        }
        printf("}\n");
    }

    if (tidx)
    {
        // If shape is changing we still can support printing a single step
        auto dimsign = get_global_array_signature(fp, io, variable);
        bool changingShape = false;
        for (auto d : dimsign)
        {
            if (d == 0)
            {
                changingShape = true;
                break;
            }
        }
        if (changingShape && stepCount > 1)
        {
            printf("ERROR: This variable has a changing shape over time, "
                   "so bpls cannot dump it as a global array. \n");
            printf("You can dump a single step with\n"
                   "    bpls -d %s -s \"T",
                   variable->m_Name.c_str());
            for (j = 0; j < ndim; j++)
            {
                printf(",0");
            }
            printf("\" -c \"1");
            for (j = 0; j < ndim; j++)
            {
                printf(",-1");
            }
            printf("\"\nwhere T is a number between 0 and %d,\n", nsteps - 1);
            printf("or dump each block separately with \n"
                   "    bpls -dD %s\n",
                   variable->m_Name.c_str());
            return -1;
        }
    }

    for (j = 0; j < ndim; j++)
    {
        uint64_t st, ct;
        if (istart[j + tidx] < 0) // negative index means last-|index|
            st = shape[j] + istart[j + tidx];
        else
            st = istart[j + tidx];
        if (icount[j + tidx] < 0) // negative index means last-|index|+1-start
            ct = shape[j] + icount[j + tidx] + 1 - st;
        else
            ct = icount[j + tidx];

        if (verbose > 2)
            printf("    j=%d, st=%" PRIu64 " ct=%" PRIu64 "\n", j + tidx, st, ct);

        start_t[j + tidx] = st;
        count_t[j + tidx] = ct;
        nelems *= ct;
        if (verbose > 1)
            printf("    s[%d]=%" PRIu64 ", c[%d]=%" PRIu64 ", n=%" PRIu64 "\n", j + tidx,
                   start_t[j + tidx], j + tidx, count_t[j + tidx], nelems);
    }

    if (verbose > 1)
    {
        printf(" total size of data to read = %" PRIu64 "\n", nelems * elemsize);
    }

    print_slice_info(variable, (tidx == 1), start_t, count_t, shape);

    maxreadn = (uint64_t)MAX_BUFFERSIZE / elemsize;
    if (nelems < maxreadn)
        maxreadn = nelems;

    bool xmlprint = helper::EndsWith(variable->m_Name, ".xml", false);
    if (xmlprint && nelems > maxreadn)
        maxreadn = nelems;

    // special case: string. Need to use different elemsize
    /*if (vi->type == DataType::String)
    {
        if (vi->value)
            elemsize = strlen(vi->value) + 1;
        maxreadn = elemsize;
    }*/

    // allocate data array
    // data = (T *)malloc(maxreadn * elemsize);

    // determine strategy how to read in:
    //  - at once
    //  - loop over 1st dimension
    //  - loop over 1st & 2nd dimension
    //  - etc
    if (verbose > 1)
        printf("Read size strategy:\n");
    sum = (uint64_t)1;
    actualreadn = (uint64_t)1;
    for (i = tdims - 1; i >= 0; i--)
    {
        if (sum >= (uint64_t)maxreadn)
        {
            readn[i] = 1;
        }
        else
        {
            readn[i] = maxreadn / (int)sum; // sum is small for 4 bytes here
            // this may be over the max count for this dimension
            if (readn[i] > count_t[i])
                readn[i] = count_t[i];
        }
        if (verbose > 1)
            printf("    dim %d: read %" PRIu64 " elements\n", i, readn[i]);
        sum = sum * (uint64_t)count_t[i];
        actualreadn = actualreadn * readn[i];
    }
    if (verbose > 1)
        printf("    read %" PRIu64 " elements at once, %" PRIu64 " in total (nelems=%" PRIu64 ")\n",
               actualreadn, sum, nelems);

    // init s and c
    // and calculate ndigits_dims
    for (j = 0; j < tdims; j++)
    {
        s[j] = start_t[j];
        c[j] = readn[j];

        ndigits_dims[j] =
            ndigits(start_t[j] + count_t[j] - 1); // -1: dim=100 results in 2 digits (0..99)
    }

    // read until read all 'nelems' elements
    sum = 0;
    while (sum < nelems)
    {

        // how many elements do we read in next?
        actualreadn = 1;
        for (j = 0; j < tdims; j++)
            actualreadn *= c[j];

        if (verbose > 2)
        {
            printf("adios_read_var name=%s ", variable->m_Name.c_str());
            PRINT_DIMS_UINT64("  start", s, tdims, j);
            PRINT_DIMS_UINT64("  count", c, tdims, j);
            printf("  read %" PRIu64 " elems\n", actualreadn);
        }

        // read a slice finally
        const Dims startv = variable->m_ShapeID == ShapeID::GlobalArray
                                ? helper::Uint64ArrayToSizetVector(tdims - tidx, s + tidx)
                                : Dims();
        const Dims countv = variable->m_ShapeID == ShapeID::GlobalArray
                                ? helper::Uint64ArrayToSizetVector(tdims - tidx, c + tidx)
                                : Dims();

        if (verbose > 2)
        {
            printf("set selection: ");
            PRINT_DIMS_SIZET("  start", startv.data(), tdims - tidx, j);
            PRINT_DIMS_SIZET("  count", countv.data(), tdims - tidx, j);
            printf("\n");
        }

        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            variable->SetSelection({startv, countv});
        }

        if (tidx)
        {
            if (verbose > 2)
            {
                printf("set Step selection: from relative step %" PRIu64 " read %" PRIu64
                       " steps\n",
                       s[0], c[0]);
            }
            variable->SetStepSelection({s[0], c[0]});
        }

        dataV.resize(variable->SelectionSize());
        fp->Get(*variable, dataV, adios2::Mode::Sync);

        // print slice
        print_dataset(dataV.data(), variable->m_Type, s, c, tdims, ndigits_dims);

        // prepare for next read
        sum += actualreadn;
        bool incdim = true; // last dim should be increased
        for (j = tdims - 1; j >= 0; j--)
        {
            if (incdim)
            {
                if (s[j] + c[j] == start_t[j] + count_t[j])
                {
                    // reached the end of this dimension
                    s[j] = start_t[j];
                    c[j] = readn[j];
                    incdim = true; // previous dim can increase too
                }
                else
                {
                    // move up in this dimension up to total count
                    s[j] += readn[j];
                    if (s[j] + c[j] > start_t[j] + count_t[j])
                    {
                        // do not reach over the limit
                        c[j] = start_t[j] + count_t[j] - s[j];
                    }
                    incdim = false;
                }
            }
        }
    } // end while sum < nelems
    print_endline();

    if (accuracyWasSet)
    {
        adios2::Accuracy a = variable->GetAccuracy();
        std::cout << "Read accuracy was (error = " << a.error << ", norm = " << a.norm << ", "
                  << (a.relative ? "rel" : "abs") << ")\n";
    }

    return 0;
}